

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateSampledImageUses
          (ConvertToSampledImagePass *this,Instruction *image_load,Instruction *image_extraction,
          DescriptorSetAndBinding *image_descriptor_set_binding)

{
  Instruction *sampled_image_inst;
  Instruction *inst;
  pointer ppIVar1;
  bool bVar2;
  uint32_t before;
  uint32_t after;
  DefUseManager *this_00;
  pointer ppIVar3;
  initializer_list<unsigned_int> init_list;
  Instruction *local_a8;
  uint32_t local_9c;
  Instruction *local_98;
  ConvertToSampledImagePass *local_90;
  IRContext *local_88;
  DescriptorSetAndBinding *local_80;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  sampled_image_users;
  SmallVector<unsigned_int,_2UL> local_58;
  
  sampled_image_users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sampled_image_users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sampled_image_users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = image_load;
  local_80 = image_descriptor_set_binding;
  FindUses(this,image_load,&sampled_image_users,OpSampledImage);
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  ppIVar1 = sampled_image_users.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = image_extraction;
  local_90 = this;
  for (ppIVar3 = sampled_image_users.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar3 != ppIVar1;
      ppIVar3 = ppIVar3 + 1) {
    sampled_image_inst = *ppIVar3;
    bVar2 = IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(this,sampled_image_inst,local_80)
    ;
    if (bVar2) {
      local_88 = (this->super_Pass).context_;
      before = Instruction::result_id(sampled_image_inst);
      inst = local_98;
      after = Instruction::result_id(local_98);
      IRContext::ReplaceAllUsesWith(local_88,before,after);
      this = local_90;
      analysis::DefUseManager::AnalyzeInstUse(this_00,inst);
      IRContext::KillInst((this->super_Pass).context_,sampled_image_inst);
    }
    else {
      if (local_a8 == (Instruction *)0x0) {
        local_a8 = CreateImageExtraction(this,local_98);
      }
      local_9c = Instruction::result_id(local_a8);
      init_list._M_len = 1;
      init_list._M_array = &local_9c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      Instruction::SetInOperand(sampled_image_inst,0,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      analysis::DefUseManager::AnalyzeInstUse(this_00,sampled_image_inst);
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&sampled_image_users.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return;
}

Assistant:

void ConvertToSampledImagePass::UpdateSampledImageUses(
    Instruction* image_load, Instruction* image_extraction,
    const DescriptorSetAndBinding& image_descriptor_set_binding) {
  std::vector<Instruction*> sampled_image_users;
  FindUses(image_load, &sampled_image_users, spv::Op::OpSampledImage);

  auto* def_use_mgr = context()->get_def_use_mgr();
  for (auto* sampled_image_inst : sampled_image_users) {
    if (IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
            sampled_image_inst, image_descriptor_set_binding)) {
      context()->ReplaceAllUsesWith(sampled_image_inst->result_id(),
                                    image_load->result_id());
      def_use_mgr->AnalyzeInstUse(image_load);
      context()->KillInst(sampled_image_inst);
    } else {
      if (!image_extraction)
        image_extraction = CreateImageExtraction(image_load);
      sampled_image_inst->SetInOperand(0, {image_extraction->result_id()});
      def_use_mgr->AnalyzeInstUse(sampled_image_inst);
    }
  }
}